

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execDiv<(moira::Instr)58,(moira::Mode)10,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 in_EAX;
  u32 uVar2;
  ulong uVar3;
  u32 divisor;
  u32 ea;
  
  divisor = in_EAX;
  bVar1 = readOp<(moira::Mode)10,(moira::Size)2,128ul>(this,opcode & 7,&ea,&divisor);
  if (bVar1) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    uVar2 = *(u32 *)((long)this->exec + uVar3 * 4 + -0x58);
    if (divisor == 0) {
      (this->reg).sr.n = SUB41(uVar2 >> 0x1f,0);
      (this->reg).sr.z = uVar2 < 0x10000;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
      (*this->_vptr_Moira[0x19])(this,8);
      execTrapException(this,5);
    }
    else {
      uVar2 = div<(moira::Instr)58>(this,uVar2,divisor);
      *(u32 *)((long)this->exec + uVar3 * 4 + -0x58) = uVar2;
      prefetch<4ul>(this);
    }
  }
  return;
}

Assistant:

void
Moira::execDiv(u16 opcode)
{
    if (MIMIC_MUSASHI) {
        execDivMusashi<I, M, S>(opcode);
        return;
    }

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, divisor, result;
    if (!readOp <M,Word, STD_AE_FRAME> (src, ea, divisor)) return;
    u32 dividend = readD(dst);
    
    // Check for division by zero
    if (divisor == 0) {

        if (I == DIVU) {
            reg.sr.n = NBIT<Long>(dividend);
            reg.sr.z = (dividend & 0xFFFF0000) == 0;
            reg.sr.v = 0;
            reg.sr.c = 0;
        } else {
            reg.sr.n = 0;
            reg.sr.z = 1;
            reg.sr.v = 0;
            reg.sr.c = 0;
        }

        sync(8);
        execTrapException(5);
        return;
    }

    result = div<I>(dividend, divisor);

    writeD(dst, result);
    prefetch<POLLIPL>();
}